

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool is_name_only(char *path)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  __int32_t **pp_Var4;
  char *__dest;
  char ext [260];
  char temp [260];
  char fname [260];
  char current_dir [260];
  char drive [260];
  char local_558 [272];
  char local_448 [272];
  char local_338 [272];
  char local_228 [272];
  char local_118 [264];
  
  if (*path == '\0') {
    return false;
  }
  split_path(path,local_118,local_228,local_338,local_558);
  _Var2 = false;
  if ((local_228[0] == '\0') && (_Var2 = false, local_338[0] != '\0')) {
    if (local_558[0] != '\0') {
      __dest = local_448;
      strcpy(__dest,local_558);
      for (; cVar1 = *__dest, (long)cVar1 != 0; __dest = __dest + 1) {
        pp_Var4 = __ctype_tolower_loc();
        *__dest = (char)(*pp_Var4)[cVar1];
      }
      iVar3 = strcmp(local_448,G_VOICE_EXT);
      if (iVar3 == 0) {
        return false;
      }
    }
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool is_name_only(const char *path)
{
	if (strlen(path) == 0)
	{
		return false;
	}
	char drive[MAX_PATH];
	char current_dir[MAX_PATH];
	char fname[MAX_PATH];
	char ext[MAX_PATH];
	split_path(path, drive, current_dir, fname, ext);
#if defined(_WIN32)
	if (strlen(drive) != 0)
	{
		return false;
	}
#endif
	if (strlen(current_dir) != 0)
	{
		return false;
	}
	if (strlen(fname) == 0)
	{
		return false;
	}
	if (strlen(ext) != 0)
	{
		char temp[MAX_PATH];
		strcpy(temp, ext);
		char *p;
		for (p = temp; *p; p++)
		{
			*p = tolower(*p);
		}
		if (strcmp(temp, G_VOICE_EXT) == 0)
		{
			return false;
		}
	}
	return true;
}